

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

ExperimentalNs * __thiscall webrtc::Config::Get<webrtc::ExperimentalNs>(Config *this)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  key_type local_c;
  
  local_c = kExperimentalNs;
  cVar1 = std::
          _Rb_tree<webrtc::ConfigOptionID,_std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>,_std::_Select1st<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>,_std::less<webrtc::ConfigOptionID>,_std::allocator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>_>
          ::find((_Rb_tree<webrtc::ConfigOptionID,_std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>,_std::_Select1st<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>,_std::less<webrtc::ConfigOptionID>,_std::allocator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>_>
                  *)this,&local_c);
  if (((_Rb_tree_header *)cVar1._M_node == &(this->options_)._M_t._M_impl.super__Rb_tree_header) ||
     (p_Var2 = (cVar1._M_node[1]._M_parent)->_M_parent, p_Var2 == (_Base_ptr)0x0)) {
    p_Var2 = (_Base_ptr)default_value<webrtc::ExperimentalNs>();
  }
  return (ExperimentalNs *)p_Var2;
}

Assistant:

const T& Config::Get() const {
  OptionMap::const_iterator it = options_.find(identifier<T>());
  if (it != options_.end()) {
    const T* t = static_cast<Option<T>*>(it->second)->value;
    if (t) {
      return *t;
    }
  }
  return default_value<T>();
}